

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O3

void __thiscall
dg::dda::LLVMReadWriteGraphBuilder::LLVMReadWriteGraphBuilder
          (LLVMReadWriteGraphBuilder *this,Module *m,LLVMPointerAnalysis *p,
          LLVMDataDependenceAnalysisOptions *opts)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._module = m;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_buckets =
       &(this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
        _subgraphs._M_h._M_single_bucket;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_bucket_count = 1;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_element_count = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._subgraphs.
  _M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_buckets = &(this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
                _nodes._M_h._M_single_bucket;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_bucket_count = 1;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_element_count = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_rehash_policy._M_next_resize = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodes._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_buckets =
       &(this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
        _nodeToValue._M_h._M_single_bucket;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_bucket_count = 1;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_element_count = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._nodeToValue.
  _M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._globals.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._globals.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>)._globals.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
  _vptr_GraphBuilder = (_func_int **)&PTR__LLVMReadWriteGraphBuilder_0011ebd0;
  this->_options = opts;
  this->PTA = p;
  this->buildUses = true;
  (this->graph).lastNodeID = 0;
  (this->graph)._nodes.
  super__Vector_base<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph)._nodes.
  super__Vector_base<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph)._nodes.
  super__Vector_base<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph)._subgraphs.
  super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph)._subgraphs.
  super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph)._subgraphs.
  super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph)._entry = (RWSubgraph *)0x0;
  p_Var1 = &(this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header;
  (this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->threadCreateCalls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header;
  (this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->threadJoinCalls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

GraphBuilder(const llvm::Module *m) : _module(m) {}